

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::BuildsystemFileScope::BuildsystemFileScope(BuildsystemFileScope *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmake *pcVar3;
  PositionType PVar4;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar5;
  string *psVar6;
  cmState *pcVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string currentStart;
  string local_90;
  cmStateDirectory local_70;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined8 local_38;
  char *local_30;
  
  this->Makefile = mf;
  cmStateSnapshot::cmStateSnapshot(&this->Snapshot,(cmState *)0x0);
  this->ReportError = true;
  cmStateSnapshot::GetDirectory(&local_70,&this->Makefile->StateSnapshot);
  psVar6 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_70);
  local_48._M_str = (psVar6->_M_dataplus)._M_p;
  local_48._M_len = psVar6->_M_string_length;
  local_38 = 0xf;
  local_30 = "/CMakeLists.txt";
  views._M_len = 2;
  views._M_array = &local_48;
  cmCatViews_abi_cxx11_(&local_90,views);
  cmStateSnapshot::SetListFile(&this->Makefile->StateSnapshot,&local_90);
  pcVar7 = cmStateSnapshot::GetState(&this->Makefile->StateSnapshot);
  cmState::CreatePolicyScopeSnapshot
            ((cmStateSnapshot *)&local_70,pcVar7,&this->Makefile->StateSnapshot);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = (PositionType)local_70.Snapshot_.State;
  (pcVar1->StateSnapshot).State = (cmState *)local_70.DirectoryState.Tree;
  (pcVar1->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_70.DirectoryState.Position;
  PushFunctionBlockerBarrier(this->Makefile);
  pcVar2 = mf->GlobalGenerator;
  this->GG = pcVar2;
  this->CurrentMakefile = pcVar2->CurrentConfigureMakefile;
  pcVar3 = pcVar2->CMakeInstance;
  pcVar7 = (pcVar3->CurrentSnapshot).State;
  pcVar5 = (pcVar3->CurrentSnapshot).Position.Tree;
  PVar4 = (pcVar3->CurrentSnapshot).Position.Position;
  (this->Snapshot).Position.Position = PVar4;
  (this->Snapshot).State = pcVar7;
  (this->Snapshot).Position.Tree = pcVar5;
  pcVar3 = pcVar2->CMakeInstance;
  (pcVar3->CurrentSnapshot).Position.Position = PVar4;
  (pcVar3->CurrentSnapshot).State = pcVar7;
  (pcVar3->CurrentSnapshot).Position.Tree = pcVar5;
  pcVar2 = this->GG;
  pcVar2->CurrentConfigureMakefile = mf;
  cmFileLockPool::PushFileScope(&pcVar2->FileLockPool);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

BuildsystemFileScope(cmMakefile* mf)
    : Makefile(mf)
  {
    std::string currentStart =
      cmStrCat(this->Makefile->StateSnapshot.GetDirectory().GetCurrentSource(),
               "/CMakeLists.txt");
    this->Makefile->StateSnapshot.SetListFile(currentStart);
    this->Makefile->StateSnapshot =
      this->Makefile->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
        this->Makefile->StateSnapshot);
    this->Makefile->PushFunctionBlockerBarrier();

    this->GG = mf->GetGlobalGenerator();
    this->CurrentMakefile = this->GG->GetCurrentMakefile();
    this->Snapshot = this->GG->GetCMakeInstance()->GetCurrentSnapshot();
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
    this->GG->SetCurrentMakefile(mf);
#if !defined(CMAKE_BOOTSTRAP)
    this->GG->GetFileLockPool().PushFileScope();
#endif
  }